

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngframe.cpp
# Opt level: O1

void __thiscall
apngasm::APNGFrame::APNGFrame(APNGFrame *this,string *filePath,uint delayNum,uint delayDen)

{
  int *piVar1;
  int *piVar2;
  uchar uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  FILE *__stream;
  size_t sVar8;
  __jmp_buf_tag *__env;
  long lVar9;
  uchar *puVar10;
  uchar **ppuVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  png_structp png_ptr;
  png_infop info_ptr;
  png_color_16p trans_color;
  png_bytep trans_alpha;
  png_colorp palette;
  uchar sig [8];
  long local_68;
  long local_60;
  int local_54;
  long local_50;
  void *local_48;
  void *local_40;
  undefined1 local_38 [8];
  
  this->_paletteSize = 0;
  this->_transparencySize = 0;
  this->_pixels = (uchar *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_colorType = '\0';
  this->_delayNum = delayNum;
  this->_delayDen = delayDen;
  this->_rows = (uchar **)0x0;
  __stream = fopen((filePath->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  sVar8 = fread(local_38,1,8,__stream);
  if ((sVar8 != 8) || (iVar5 = png_sig_cmp(local_38,0,8), iVar5 != 0)) goto LAB_00154063;
  local_68 = png_create_read_struct("1.6.37",0,0);
  local_60 = png_create_info_struct(local_68);
  if (local_60 != 0 && local_68 != 0) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_68,longjmp,200);
    iVar5 = _setjmp(__env);
    if (iVar5 == 0) {
      piVar1 = &this->_paletteSize;
      local_54 = iVar5;
      png_init_io(local_68,__stream);
      png_set_sig_bytes(local_68,8);
      png_read_info(local_68,local_60);
      uVar6 = png_get_image_width(local_68,local_60);
      this->_width = uVar6;
      uVar6 = png_get_image_height(local_68,local_60);
      this->_height = uVar6;
      uVar3 = png_get_color_type(local_68,local_60);
      this->_colorType = uVar3;
      bVar4 = png_get_bit_depth(local_68,local_60);
      if (bVar4 < 8) {
        if (this->_colorType == '\x03') {
          png_set_packing();
        }
        else {
          png_set_expand(local_68);
        }
      }
      else if (bVar4 != 8) {
        png_set_expand(local_68);
        png_set_strip_16(local_68);
      }
      piVar2 = &this->_transparencySize;
      png_set_interlace_handling(local_68);
      png_read_update_info(local_68,local_60);
      uVar3 = png_get_color_type(local_68,local_60);
      this->_colorType = uVar3;
      lVar9 = png_get_rowbytes(local_68,local_60);
      memset(this->_palette,0xff,0x400);
      iVar5 = png_get_PLTE(local_68,local_60,&local_40,piVar1);
      if (iVar5 == 0) {
        *piVar1 = 0;
      }
      else {
        memcpy(this->_palette,local_40,(long)*piVar1 * 3);
      }
      iVar7 = png_get_tRNS(local_68,local_60,&local_48,piVar2,&local_50);
      iVar5 = local_54;
      if (iVar7 == 0) {
LAB_00153fcd:
        *piVar2 = 0;
      }
      else if (0 < (long)*piVar2) {
        uVar3 = this->_colorType;
        if (uVar3 == '\x03') {
          memcpy(this->_transparency,local_48,(long)*piVar2);
        }
        else if (uVar3 == '\x02') {
          this->_transparency[0] = '\0';
          this->_transparency[1] = *(uchar *)(local_50 + 2);
          this->_transparency[2] = '\0';
          this->_transparency[3] = *(uchar *)(local_50 + 4);
          this->_transparency[4] = '\0';
          this->_transparency[5] = *(uchar *)(local_50 + 6);
          this->_transparencySize = 6;
        }
        else {
          if (uVar3 != '\0') goto LAB_00153fcd;
          this->_transparency[0] = '\0';
          this->_transparency[1] = *(uchar *)(local_50 + 8);
          this->_transparencySize = 2;
        }
      }
      uVar14 = (ulong)this->_height;
      puVar10 = (uchar *)operator_new__((ulong)(this->_height * (int)lVar9));
      this->_pixels = puVar10;
      ppuVar11 = (uchar **)operator_new__(uVar14 << 6);
      this->_rows = ppuVar11;
      if (uVar14 != 0) {
        uVar12 = 0;
        uVar13 = uVar12;
        do {
          this->_rows[uVar13] = this->_pixels + (uVar12 & 0xffffffff);
          uVar13 = uVar13 + 1;
          uVar12 = uVar12 + lVar9;
        } while (uVar14 != uVar13);
      }
      png_read_image(local_68,this->_rows);
      png_read_end(local_68,0);
    }
    else {
      png_destroy_read_struct(&local_68,&local_60,0);
      fclose(__stream);
    }
    if (iVar5 != 0) {
      return;
    }
  }
  png_destroy_read_struct(&local_68,&local_60,0);
LAB_00154063:
  fclose(__stream);
  return;
}

Assistant:

APNGFrame::APNGFrame(const std::string &filePath, unsigned delayNum,
                     unsigned delayDen)
    : _pixels(NULL), _width(0), _height(0), _colorType(0), _paletteSize(0),
      _transparencySize(0), _delayNum(delayNum), _delayDen(delayDen),
      _rows(NULL) {
  // TODO save extracted info to self
  FILE *f;
  if ((f = fopen(filePath.c_str(), "rb")) != 0) {
    unsigned char sig[8];

    if (fread(sig, 1, 8, f) == 8 && png_sig_cmp(sig, 0, 8) == 0) {
      png_structp png_ptr =
          png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
      png_infop info_ptr = png_create_info_struct(png_ptr);
      if (png_ptr && info_ptr) {
        png_byte depth;
        png_uint_32 rowbytes, i;
        png_colorp palette;
        png_color_16p trans_color;
        png_bytep trans_alpha;

        if (setjmp(png_jmpbuf(png_ptr))) {
          png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
          fclose(f);
          return;
        }

        png_init_io(png_ptr, f);
        png_set_sig_bytes(png_ptr, 8);
        png_read_info(png_ptr, info_ptr);
        _width = png_get_image_width(png_ptr, info_ptr);
        _height = png_get_image_height(png_ptr, info_ptr);
        _colorType = png_get_color_type(png_ptr, info_ptr);
        depth = png_get_bit_depth(png_ptr, info_ptr);
        if (depth < 8) {
          if (_colorType == PNG_COLOR_TYPE_PALETTE)
            png_set_packing(png_ptr);
          else
            png_set_expand(png_ptr);
        } else if (depth > 8) {
          png_set_expand(png_ptr);
          png_set_strip_16(png_ptr);
        }
        (void)png_set_interlace_handling(png_ptr);
        png_read_update_info(png_ptr, info_ptr);
        _colorType = png_get_color_type(png_ptr, info_ptr);
        rowbytes = png_get_rowbytes(png_ptr, info_ptr);
        memset(_palette, 255, sizeof(_palette));
        memset(_transparency, 255, sizeof(_transparency));

        if (png_get_PLTE(png_ptr, info_ptr, &palette, &_paletteSize))
          memcpy(_palette, palette, _paletteSize * 3);
        else
          _paletteSize = 0;

        if (png_get_tRNS(png_ptr, info_ptr, &trans_alpha, &_transparencySize,
                         &trans_color)) {
          if (_transparencySize > 0) {
            if (_colorType == PNG_COLOR_TYPE_GRAY) {
              _transparency[0] = 0;
              _transparency[1] = trans_color->gray & 0xFF;
              _transparencySize = 2;
            } else if (_colorType == PNG_COLOR_TYPE_RGB) {
              _transparency[0] = 0;
              _transparency[1] = trans_color->red & 0xFF;
              _transparency[2] = 0;
              _transparency[3] = trans_color->green & 0xFF;
              _transparency[4] = 0;
              _transparency[5] = trans_color->blue & 0xFF;
              _transparencySize = 6;
            } else if (_colorType == PNG_COLOR_TYPE_PALETTE)
              memcpy(_transparency, trans_alpha, _transparencySize);
            else
              _transparencySize = 0;
          }
        } else
          _transparencySize = 0;

        _pixels = new unsigned char[_height * rowbytes];
        _rows = new png_bytep[_height * sizeof(png_bytep)];

        for (i = 0; i < _height; ++i)
          _rows[i] = _pixels + i * rowbytes;

        png_read_image(png_ptr, _rows);
        png_read_end(png_ptr, NULL);
      }
      png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
    }
    fclose(f);
  }
}